

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::RealisticCamera,pbrt::CameraBaseParameters&,std::vector<float,std::allocator<float>>&,float&,float&,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,RealisticCamera *p,CameraBaseParameters *args,
          vector<float,_std::allocator<float>_> *args_1,float *args_2,float *args_3,Image *args_4,
          polymorphic_allocator<std::byte> *args_5)

{
  Float focusDistance;
  Float setApertureDiameter;
  Image local_498;
  CameraBaseParameters local_380;
  
  memcpy(&local_380,args,0x340);
  local_380.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (args->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_380.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(args->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  focusDistance = *args_2;
  setApertureDiameter = *args_3;
  local_498.resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (args_4->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_498.format = args_4->format;
  local_498.resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (args_4->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&local_498.channelNames,&args_4->channelNames);
  local_498.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(args_4->encoding).
           super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
           .bits;
  local_498.p8.alloc.memoryResource = (args_4->p8).alloc.memoryResource;
  local_498.p8.nAlloc = (args_4->p8).nAlloc;
  local_498.p8.nStored = (args_4->p8).nStored;
  local_498.p8.ptr = (args_4->p8).ptr;
  (args_4->p8).nStored = 0;
  (args_4->p8).ptr = (uchar *)0x0;
  (args_4->p8).nAlloc = 0;
  local_498.p16.alloc.memoryResource = (args_4->p16).alloc.memoryResource;
  local_498.p16.nAlloc = (args_4->p16).nAlloc;
  local_498.p16.nStored = (args_4->p16).nStored;
  local_498.p16.ptr = (args_4->p16).ptr;
  (args_4->p16).nStored = 0;
  (args_4->p16).ptr = (Half *)0x0;
  (args_4->p16).nAlloc = 0;
  local_498.p32.alloc.memoryResource = (args_4->p32).alloc.memoryResource;
  local_498.p32.nAlloc = (args_4->p32).nAlloc;
  local_498.p32.nStored = (args_4->p32).nStored;
  local_498.p32.ptr = (args_4->p32).ptr;
  (args_4->p32).nStored = 0;
  (args_4->p32).ptr = (float *)0x0;
  (args_4->p32).nAlloc = 0;
  pbrt::RealisticCamera::RealisticCamera
            (p,&local_380,args_1,focusDistance,setApertureDiameter,&local_498,args_5->memoryResource
            );
  local_498.p32.nStored = 0;
  (*(local_498.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_498.p32.alloc.memoryResource,local_498.p32.ptr,local_498.p32.nAlloc << 2,4);
  local_498.p16.nStored = 0;
  (*(local_498.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_498.p16.alloc.memoryResource,local_498.p16.ptr,local_498.p16.nAlloc * 2,2);
  local_498.p8.nStored = 0;
  (*(local_498.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_498.p8.alloc.memoryResource,local_498.p8.ptr,local_498.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_498.channelNames);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }